

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void predict_or_learn<true,false,true,true>(oaa *o,single_learner *base,example *ec)

{
  polyprediction *ppVar1;
  float fVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  uint32_t i;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  v_array<float> scores_array;
  stringstream outputStringStream;
  
  uVar3 = (ec->l).multi.label;
  fVar2 = (ec->l).simple.weight;
  if (((ulong)uVar3 == 0) || ((uVar3 != 0xffffffff && (o->k < (ulong)uVar3)))) {
    poVar4 = std::operator<<((ostream *)&std::cout,"label ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4," is not in {1,");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
  scores_array._begin = (ec->pred).scalars._begin;
  scores_array._end = (ec->pred).scalars._end;
  scores_array.end_array = (ec->pred).scalars.end_array;
  scores_array.erase_count = (ec->pred).scalars.erase_count;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar5 = 1;
  LEARNER::learner<char,_example>::multipredict(base,ec,0,o->k,o->pred,true);
  if (ec->passthrough != (features *)0x0) {
    uVar7 = 0;
    while( true ) {
      uVar8 = uVar7 + 1;
      if (o->k < (ulong)uVar8) break;
      add_passthrough_feature_magic(ec,0x398d4541,(ulong)uVar8,o->pred[uVar7].scalar);
      uVar7 = uVar8;
    }
  }
  ppVar1 = &ec->pred;
  while (uVar7 = (uint)uVar5, uVar5 <= o->k) {
    (ec->l).simple.label = *(float *)(&DAT_002345c8 + (ulong)(uVar3 == uVar7) * 4);
    *(undefined8 *)((long)&(ec->l).cs.costs._begin + 4) = 0;
    (ec->pred).scalar = o->pred[uVar7 - 1].scalar;
    LEARNER::learner<char,_example>::update(base,ec,(ulong)(uVar7 - 1));
    uVar5 = (ulong)(uVar7 + 1);
  }
  v_array<float>::clear(&scores_array);
  for (uVar7 = 0; (ulong)uVar7 < o->k; uVar7 = uVar7 + 1) {
    v_array<float>::push_back(&scores_array,&o->pred[uVar7].scalar);
  }
  (ec->pred).scalars.end_array = scores_array.end_array;
  (ec->pred).scalars.erase_count = scores_array.erase_count;
  (ppVar1->scalars)._begin = scores_array._begin;
  (ec->pred).scalars._end = scores_array._end;
  uVar7 = 0;
  fVar9 = 0.0;
  while( true ) {
    uVar6 = (ulong)uVar7;
    uVar5 = o->k;
    if (uVar5 <= uVar6) break;
    fVar10 = expf(-(float)o->pred[uVar6].multiclass);
    (ppVar1->scalars)._begin[uVar6] = 1.0 / (fVar10 + 1.0);
    fVar9 = fVar9 + (ppVar1->scalars)._begin[uVar6];
    uVar7 = uVar7 + 1;
  }
  for (uVar7 = 0; uVar6 = (ulong)uVar7, uVar6 < uVar5; uVar7 = uVar7 + 1) {
    (ppVar1->scalars)._begin[uVar6] = (ppVar1->scalars)._begin[uVar6] * (1.0 / fVar9);
    uVar5 = o->k;
  }
  (ec->l).multi.label = uVar3;
  (ec->l).simple.weight = fVar2;
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}